

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

void __thiscall
dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::isolate
          (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this)

{
  BBlock<dg::LLVMNode> *this_00;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *this_01;
  pair<std::_Rb_tree_iterator<dg::LLVMNode_*>,_std::_Rb_tree_iterator<dg::LLVMNode_*>_> pVar1;
  key_type local_18;
  
  removeOutcomingDDs(this);
  removeIncomingDDs(this);
  removeOutcomingUses(this);
  removeIncomingUses(this);
  removeOutcomingCDs(this);
  removeIncomingCDs(this);
  if (this->basicBlock != (BBlock<dg::LLVMNode> *)0x0) {
    local_18 = (key_type)this;
    std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::remove
              (&this->basicBlock->nodes,(char *)&local_18);
    this_00 = this->basicBlock;
    if ((this_00->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)&this_00->nodes) {
      BBlock<dg::LLVMNode>::remove(this_00,(char *)0x1);
    }
    if ((this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      this_01 = &this->basicBlock->callSites;
      local_18 = (key_type)this;
      pVar1 = std::
              _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
              ::equal_range(&this_01->_M_t,&local_18);
      std::
      _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
      ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar1.first._M_node,(_Base_ptr)pVar1.second._M_node);
    }
    this->basicBlock = (BBlock<dg::LLVMNode> *)0x0;
  }
  return;
}

Assistant:

void isolate() {
        // remove CD and DD and uses from this node
        removeDDs();
        removeUses();
        removeCDs();

#ifdef ENABLE_CFG
        // if this is head or tail of BB,
        // we must take it into account
        if (basicBlock) {
            // XXX removing the node from BB is in linear time,
            // could we do it better?
            basicBlock->removeNode(static_cast<NodeT *>(this));

            // if this was the only node in BB, remove the BB
            if (basicBlock->empty())
                basicBlock->remove();

            // if this is a callSite it is no longer part of BBlock,
            // so we must remove it from callSites
            if (hasSubgraphs()) {
#ifndef NDEBUG
                bool ret =
#endif
                        basicBlock->removeCallSite(static_cast<NodeT *>(this));
                assert(ret && "the call site was not in BB's callSites");
            }

            basicBlock = nullptr;
        }
#endif
    }